

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

void __thiscall World::World(World *this)

{
  vector<PointLight_*,_std::allocator<PointLight_*>_> *pvVar1;
  vector<SceneObject_*,_std::allocator<SceneObject_*>_> *pvVar2;
  ColorRGB local_1c;
  
  ColorRGB::ColorRGB(&this->ambientColor);
  ColorRGB::ColorRGB(&this->backgroundColor);
  pvVar1 = (vector<PointLight_*,_std::allocator<PointLight_*>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pointLights = pvVar1;
  pvVar2 = (vector<SceneObject_*,_std::allocator<SceneObject_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sceneObjects = pvVar2;
  ColorRGB::ColorRGB(&local_1c,0.02,0.02,0.02);
  (this->ambientColor).b = local_1c.b;
  (this->ambientColor).r = local_1c.r;
  (this->ambientColor).g = local_1c.g;
  ColorRGB::ColorRGB(&local_1c,0.1,0.1,0.1);
  (this->backgroundColor).b = local_1c.b;
  (this->backgroundColor).r = local_1c.r;
  (this->backgroundColor).g = local_1c.g;
  this->backgroundEnabled = true;
  return;
}

Assistant:

World::World() {
    pointLights = new std::vector<PointLight*>();
    sceneObjects = new std::vector<SceneObject*>();
    ambientColor = ColorRGB(0.02, 0.02, 0.02);
    backgroundColor = ColorRGB(0.1, 0.1, 0.1);
    backgroundEnabled = true;
}